

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_set_variable.cpp
# Opt level: O3

SinkResultType __thiscall
duckdb::PhysicalSetVariable::Sink
          (PhysicalSetVariable *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSinkInput *input)

{
  GlobalSinkState *pGVar1;
  ClientConfig *pCVar2;
  mapped_type *this_00;
  InvalidInputException *this_01;
  string local_88;
  Value local_68;
  
  if ((chunk->count == 1) && (pGVar1 = input->global_state, pGVar1->field_0x51 != '\x01')) {
    pCVar2 = ClientConfig::GetConfig(context->client);
    DataChunk::GetValue(&local_68,chunk,0,0);
    this_00 = ::std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&pCVar2->user_variables,&this->name);
    Value::operator=(this_00,&local_68);
    Value::~Value(&local_68);
    pGVar1->field_0x51 = 1;
    return NEED_MORE_INPUT;
  }
  this_01 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,"PhysicalSetVariable can only handle a single value","");
  InvalidInputException::InvalidInputException(this_01,&local_88);
  __cxa_throw(this_01,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

SinkResultType PhysicalSetVariable::Sink(ExecutionContext &context, DataChunk &chunk, OperatorSinkInput &input) const {
	auto &gstate = input.global_state.Cast<SetVariableGlobalState>();
	if (chunk.size() != 1 || gstate.is_set) {
		throw InvalidInputException("PhysicalSetVariable can only handle a single value");
	}
	auto &config = ClientConfig::GetConfig(context.client);
	config.SetUserVariable(name, chunk.GetValue(0, 0));
	gstate.is_set = true;
	return SinkResultType::NEED_MORE_INPUT;
}